

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O1

double AlphaVectorPruning::GetBeliefDiff
                 (vector<double,_std::allocator<double>_> *belief0,
                 vector<double,_std::allocator<double>_> *belief1)

{
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pdVar1 = (belief0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(belief0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar4 == 0) {
    dVar7 = 0.0;
  }
  else {
    pdVar2 = (belief1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = 0.0;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    uVar5 = 0;
    uVar6 = 1;
    do {
      if ((ulong)((long)(belief1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pdVar1[uVar5] - pdVar2[uVar5];
      auVar9 = vandpd_avx(auVar9,auVar8);
      dVar7 = dVar7 + auVar9._0_8_;
      bVar3 = uVar6 < (ulong)(lVar4 >> 3);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  return dVar7;
}

Assistant:

double AlphaVectorPruning::GetBeliefDiff(vector<double> &belief0, vector<double> &belief1)
{
    size_t nrStates = belief0.size();
    double totalDiff = 0.0;

    for(Index j=0; j<nrStates; j++)
    {
        totalDiff = totalDiff + std::abs(belief0.at(j)-belief1.at(j));
    }

    return totalDiff;
}